

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qitemselectionmodel.cpp
# Opt level: O3

void QItemSelectionModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayDataPointer<QItemSelectionRange> *other;
  long *plVar1;
  QArrayDataPointer<QModelIndex> *this;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  __atomic_base<int> _Var5;
  Data *pDVar6;
  undefined8 *puVar7;
  InterfaceType *pIVar8;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  ulong uVar9;
  QModelIndex *pQVar10;
  int iVar11;
  undefined4 in_register_00000034;
  void *pvVar12;
  InterfaceType *iface;
  long in_FS_OFFSET;
  undefined1 local_40 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      tStack_30.ptr = (QAbstractItemModel *)_a[1];
      local_28 = (undefined1 *)_a[2];
      iVar11 = 0;
      break;
    case 1:
      tStack_30.ptr = (QAbstractItemModel *)_a[1];
      local_28 = (undefined1 *)_a[2];
      iVar11 = 1;
      break;
    case 2:
      tStack_30.ptr = (QAbstractItemModel *)_a[1];
      local_28 = (undefined1 *)_a[2];
      iVar11 = 2;
      break;
    case 3:
      tStack_30.ptr = (QAbstractItemModel *)_a[1];
      local_28 = (undefined1 *)_a[2];
      iVar11 = 3;
      break;
    case 4:
      local_40._0_8_ = *_a[1];
      tStack_30.ptr = (QAbstractItemModel *)local_40;
      iVar11 = 4;
      break;
    case 5:
      pvVar12 = _a[1];
      uVar9 = (ulong)*_a[2];
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0xc];
      goto LAB_00460d90;
    case 6:
      pvVar12 = _a[1];
      uVar9 = (ulong)*_a[2];
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0xd];
      goto LAB_00460d90;
    case 7:
      pvVar12 = _a[1];
      uVar9 = (ulong)*_a[2];
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0xe];
LAB_00460d90:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (*UNRECOVERED_JUMPTABLE_00)(_o,pvVar12,uVar9,UNRECOVERED_JUMPTABLE_00);
        return;
      }
      goto LAB_00460edf;
    case 8:
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0xf];
      goto LAB_00460e00;
    case 9:
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x10];
      goto LAB_00460e00;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clearSelection((QItemSelectionModel *)_o);
        return;
      }
      goto LAB_00460edf;
    case 0xb:
      UNRECOVERED_JUMPTABLE_00 = _o->_vptr_QObject[0x11];
LAB_00460e00:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        (*UNRECOVERED_JUMPTABLE_00)
                  (_o,CONCAT44(in_register_00000034,_c),*(long *)(in_FS_OFFSET + 0x28),
                   UNRECOVERED_JUMPTABLE_00);
        return;
      }
      goto LAB_00460edf;
    case 0xc:
      bVar4 = isSelected((QItemSelectionModel *)_o,(QModelIndex *)_a[1]);
      goto LAB_00460e5b;
    case 0xd:
      pQVar10 = (QModelIndex *)_a[2];
      iVar11 = *_a[1];
      goto LAB_00460d72;
    case 0xe:
      iVar11 = *_a[1];
      pQVar10 = (QModelIndex *)(local_40 + 8);
      local_40._8_8_ = (QArrayData *)0xffffffffffffffff;
      tStack_30.ptr = (QAbstractItemModel *)0x0;
      local_28 = (undefined1 *)0x0;
LAB_00460d72:
      bVar4 = isRowSelected((QItemSelectionModel *)_o,iVar11,pQVar10);
LAB_00460e5b:
      if (*_a != (void *)0x0) {
        *(bool *)*_a = bVar4;
      }
      goto switchD_004608da_default;
    case 0xf:
      pQVar10 = (QModelIndex *)_a[2];
      iVar11 = *_a[1];
      goto LAB_00460c88;
    case 0x10:
      iVar11 = *_a[1];
      pQVar10 = (QModelIndex *)(local_40 + 8);
      local_40._8_8_ = (QArrayData *)0xffffffffffffffff;
      tStack_30.ptr = (QAbstractItemModel *)0x0;
      local_28 = (undefined1 *)0x0;
LAB_00460c88:
      bVar4 = isColumnSelected((QItemSelectionModel *)_o,iVar11,pQVar10);
      goto LAB_00460e5b;
    case 0x11:
      pQVar10 = (QModelIndex *)_a[2];
      iVar11 = *_a[1];
      goto LAB_00460dc9;
    case 0x12:
      iVar11 = *_a[1];
      pQVar10 = (QModelIndex *)(local_40 + 8);
      local_40._8_8_ = (QArrayData *)0xffffffffffffffff;
      tStack_30.ptr = (QAbstractItemModel *)0x0;
      local_28 = (undefined1 *)0x0;
LAB_00460dc9:
      bVar4 = rowIntersectsSelection((QItemSelectionModel *)_o,iVar11,pQVar10);
      goto LAB_00460e5b;
    case 0x13:
      pQVar10 = (QModelIndex *)_a[2];
      iVar11 = *_a[1];
      goto LAB_00460e53;
    case 0x14:
      iVar11 = *_a[1];
      pQVar10 = (QModelIndex *)(local_40 + 8);
      local_40._8_8_ = (QArrayData *)0xffffffffffffffff;
      tStack_30.ptr = (QAbstractItemModel *)0x0;
      local_28 = (undefined1 *)0x0;
LAB_00460e53:
      bVar4 = columnIntersectsSelection((QItemSelectionModel *)_o,iVar11,pQVar10);
      goto LAB_00460e5b;
    case 0x15:
      iVar11 = *_a[1];
      goto LAB_00460e42;
    case 0x16:
      iVar11 = 0;
LAB_00460e42:
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      tStack_30.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      selectedRows((QModelIndexList *)(local_40 + 8),(QItemSelectionModel *)_o,iVar11);
LAB_00460e92:
      if ((QArrayDataPointer<QModelIndex> *)*_a != (QArrayDataPointer<QModelIndex> *)0x0) {
        QArrayDataPointer<QModelIndex>::operator=
                  ((QArrayDataPointer<QModelIndex> *)*_a,
                   (QArrayDataPointer<QModelIndex> *)(local_40 + 8));
      }
LAB_00460ea9:
      if ((QArrayData *)local_40._8_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_40._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_40._8_8_,0x18,0x10);
        }
      }
      goto switchD_004608da_default;
    case 0x17:
      iVar11 = *_a[1];
      goto LAB_00460e8d;
    case 0x18:
      iVar11 = 0;
LAB_00460e8d:
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      tStack_30.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      selectedColumns((QModelIndexList *)(local_40 + 8),(QItemSelectionModel *)_o,iVar11);
      goto LAB_00460e92;
    default:
      goto switchD_004608da_default;
    }
    local_40._8_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar11,(void **)(local_40 + 8));
    break;
  case ReadProperty:
    if (4 < (uint)_id) break;
    this = (QArrayDataPointer<QModelIndex> *)*_a;
    switch(_id) {
    case 0:
      pDVar6 = (Data *)QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                       ::value((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                *)&(_o->d_ptr).d[1].children.d.size);
      this->d = pDVar6;
      break;
    case 1:
      bVar4 = hasSelection((QItemSelectionModel *)_o);
      *(bool *)&this->d = bVar4;
      break;
    case 2:
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QPersistentModelIndex *)&(_o->d_ptr).d[2].parent);
      this->size = (qsizetype)local_28;
      this->d = (Data *)local_40._8_8_;
      this->ptr = (QModelIndex *)tStack_30.ptr;
      break;
    case 3:
      other = (QArrayDataPointer<QItemSelectionRange> *)(local_40 + 8);
      selection((QItemSelection *)other,(QItemSelectionModel *)_o);
      QArrayDataPointer<QItemSelectionRange>::operator=
                ((QArrayDataPointer<QItemSelectionRange> *)this,other);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(other);
      break;
    case 4:
      selectedIndexes((QModelIndexList *)(local_40 + 8),(QItemSelectionModel *)_o);
      QArrayDataPointer<QModelIndex>::operator=
                (this,(QArrayDataPointer<QModelIndex> *)(local_40 + 8));
      goto LAB_00460ea9;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setModel((QItemSelectionModel *)_o,**_a);
        return;
      }
      goto LAB_00460edf;
    }
    break;
  default:
    if (_c == BindableProperty && _id == 0) {
      plVar1 = (long *)*_a;
      *plVar1 = (long)&(_o->d_ptr).d[1].children.d.size;
      plVar1[1] = (long)&QtPrivate::
                         QBindableInterfaceForProperty<QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>,_void>
                         ::iface;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == selectionChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == currentChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar2 == currentRowChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar2 == currentColumnChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar2 == modelChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 4;
    }
    break;
  case RegisterPropertyMetaType:
    if (_id == 0) {
      _Var5._M_i = (__int_type_conflict)
                   QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId.
                   _q_value.super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        iface = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
LAB_00460ab8:
        _Var5._M_i = QMetaType::registerHelper(iface);
      }
    }
    else if (_id == 3) {
      _Var5._M_i = (__int_type_conflict)
                   QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType.typeId._q_value.
                   super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        iface = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
        goto LAB_00460ab8;
      }
    }
    else {
      if (_id != 4) {
        *(undefined4 *)*_a = 0xffffffff;
        break;
      }
      _Var5._M_i = (__int_type_conflict)
                   QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType.typeId.
                   _q_value.super___atomic_base<int>._M_i;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        iface = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType;
        goto LAB_00460ab8;
      }
    }
    ((__atomic_base<int> *)*_a)->_M_i = _Var5._M_i;
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 0) {
      puVar7 = (undefined8 *)*_a;
      if (*_a[1] < 2) {
LAB_00460a55:
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
LAB_00460a5c:
        *puVar7 = pIVar8;
        break;
      }
    }
    else if (_id == 4) {
      puVar7 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
        goto LAB_00460a5c;
      }
    }
    else if (_id == 7) {
      puVar7 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_00460a55;
    }
    else {
      puVar7 = (undefined8 *)*_a;
    }
    *puVar7 = 0;
  }
switchD_004608da_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00460edf:
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QItemSelectionModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectionChanged((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[2]))); break;
        case 1: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 2: _t->currentRowChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 3: _t->currentColumnChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 4: _t->modelChanged((*reinterpret_cast< std::add_pointer_t<QAbstractItemModel*>>(_a[1]))); break;
        case 5: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 6: _t->select((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 7: _t->select((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 8: _t->clear(); break;
        case 9: _t->reset(); break;
        case 10: _t->clearSelection(); break;
        case 11: _t->clearCurrentIndex(); break;
        case 12: { bool _r = _t->isSelected((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 13: { bool _r = _t->isRowSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 14: { bool _r = _t->isRowSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 15: { bool _r = _t->isColumnSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 16: { bool _r = _t->isColumnSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 17: { bool _r = _t->rowIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 18: { bool _r = _t->rowIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 19: { bool _r = _t->columnIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 20: { bool _r = _t->columnIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 21: { QModelIndexList _r = _t->selectedRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 22: { QModelIndexList _r = _t->selectedRows();
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 23: { QModelIndexList _r = _t->selectedColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 24: { QModelIndexList _r = _t->selectedColumns();
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractItemModel* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QItemSelection & , const QItemSelection & )>(_a, &QItemSelectionModel::selectionChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentRowChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentColumnChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(QAbstractItemModel * )>(_a, &QItemSelectionModel::modelChanged, 4))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractItemModel* >(); break;
        case 3:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QItemSelection >(); break;
        case 4:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QModelIndexList >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QAbstractItemModel**>(_v) = _t->model(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->hasSelection(); break;
        case 2: *reinterpret_cast<QModelIndex*>(_v) = _t->currentIndex(); break;
        case 3: *reinterpret_cast<QItemSelection*>(_v) = _t->selection(); break;
        case 4: *reinterpret_cast<QModelIndexList*>(_v) = _t->selectedIndexes(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setModel(*reinterpret_cast<QAbstractItemModel**>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableModel(); break;
        default: break;
        }
    }
}